

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O3

shared_ptr<helics::Broker> helics::BrokerFactory::create(CoreType type,int argc,char **argv)

{
  undefined4 in_register_0000003c;
  shared_ptr<helics::Broker> sVar1;
  shared_ptr<helics::Broker> sVar2;
  string_view brokerName;
  
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_register_0000003c;
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = type;
  if (create(helics::CoreType,int,char**)::emptyString_abi_cxx11_ == '\0') {
    create();
  }
  brokerName._M_len = (ulong)(uint)argc;
  brokerName._M_str =
       (char *)create(helics::CoreType,int,char**)::emptyString_abi_cxx11_._M_string_length;
  sVar1 = create(type,brokerName,
                 (int)create(helics::CoreType,int,char**)::emptyString_abi_cxx11_._M_dataplus._M_p,
                 (char **)((ulong)argv & 0xffffffff));
  sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       sVar1.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  return (shared_ptr<helics::Broker>)
         sVar2.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Broker> create(CoreType type, int argc, char* argv[])
{
    static const std::string emptyString;
    return create(type, emptyString, argc, argv);
}